

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,FreeZeroObjVariablePS *old)

{
  int iVar1;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeZeroObjVariablePS_00334020;
  iVar1 = old->m_old_j;
  this->m_j = old->m_j;
  this->m_old_j = iVar1;
  this->m_old_i = old->m_old_i;
  this->m_bnd = old->m_bnd;
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  DSVectorBase<double>::DSVectorBase(&this->m_lRhs,&old->m_lRhs);
  DSVectorBase<double>::DSVectorBase(&this->m_rowObj,&old->m_rowObj);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_rows,&old->m_rows);
  this->m_loFree = old->m_loFree;
  return;
}

Assistant:

FreeZeroObjVariablePS(const FreeZeroObjVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_bnd(old.m_bnd)
         , m_col(old.m_col)
         , m_lRhs(old.m_lRhs)
         , m_rowObj(old.m_rowObj)
         , m_rows(old.m_rows)
         , m_loFree(old.m_loFree)
      {}